

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical.cxx
# Opt level: O2

void __thiscall Unit::Unit(Unit *this,Unit *u)

{
  long lVar1;
  
  (this->sUnitName)._M_dataplus._M_p = (pointer)&(this->sUnitName).field_2;
  (this->sUnitName)._M_string_length = 0;
  (this->sUnitName).field_2._M_local_buf[0] = '\0';
  (this->sUnitSymbol)._M_dataplus._M_p = (pointer)&(this->sUnitSymbol).field_2;
  (this->sUnitSymbol)._M_string_length = 0;
  (this->sUnitSymbol).field_2._M_local_buf[0] = '\0';
  this->nExpPrefix = u->nExpPrefix;
  for (lVar1 = 1; lVar1 != 8; lVar1 = lVar1 + 1) {
    this->siUnits[lVar1 + -1] = u->siUnits[lVar1 + -1];
  }
  this->bInvalid = u->bInvalid;
  setNames(this);
  return;
}

Assistant:

Unit::Unit( const Unit& u )
{
	nExpPrefix = u.nExpPrefix;
	for( int i=0; i<7; i++ )
		siUnits[i] = u.siUnits[i];
	bInvalid = u.bInvalid;
	setNames();
}